

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

var * __thiscall
cs::domain_manager::get_var_global<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  domain_type *this_00;
  var *pvVar1;
  
  this_00 = stack_type<cs::domain_type,_std::allocator>::bottom(&this->m_data);
  pvVar1 = domain_type::get_var(this_00,name);
  return pvVar1;
}

Assistant:

var &get_var_global(T &&name)
		{
			return m_data.bottom().get_var(name);
		}